

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O1

void __thiscall DPlayerMenu::UpdateSkins(DPlayerMenu *this)

{
  uint uVar1;
  undefined8 *puVar2;
  bool bVar3;
  FListMenuItem *pFVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  FName local_38;
  FName local_34;
  
  local_34.Index = 0x1ea;
  pFVar4 = DListMenu::GetItem(&this->super_DListMenu,&local_34);
  if (pFVar4 == (FListMenuItem *)0x0) goto LAB_0033f895;
  if (((this->PlayerClass->Type->super_PClassActor).super_PClass.Defaults[0x198] & 0x20) == 0) {
    puVar2 = (undefined8 *)
             ((ulong)(((&DAT_00a392d8)[(long)consoleplayer * 0xa8] - 1 & 0x21d) * 0x18) +
             (&DAT_00a392c8)[(long)consoleplayer * 0x54]);
    do {
      puVar5 = puVar2;
      puVar2 = (undefined8 *)*puVar5;
    } while (*(int *)(puVar5 + 1) != 0x21d);
    if (*(int *)(puVar5[2] + 0x28) == -1) goto LAB_0033f82d;
    if ((this->PlayerSkins).Count != 0) {
      (this->PlayerSkins).Count = 0;
    }
    if ((int)numskins < 1) {
      uVar6 = 0;
    }
    else {
      uVar7 = 0;
      uVar6 = 0;
      do {
        bVar3 = FPlayerClass::CheckSkin(this->PlayerClass,(int)uVar7);
        if (bVar3) {
          TArray<int,_int>::Grow(&this->PlayerSkins,1);
          (this->PlayerSkins).Array[(this->PlayerSkins).Count] = (int)uVar7;
          uVar1 = (this->PlayerSkins).Count;
          (this->PlayerSkins).Count = uVar1 + 1;
          (*pFVar4->_vptr_FListMenuItem[8])(pFVar4,(ulong)uVar1,skins + uVar7);
          puVar2 = (undefined8 *)
                   ((ulong)(((&DAT_00a392d8)[(long)consoleplayer * 0xa8] - 1 & 0x1ea) * 0x18) +
                   (&DAT_00a392c8)[(long)consoleplayer * 0x54]);
          do {
            puVar5 = puVar2;
            puVar2 = (undefined8 *)*puVar5;
          } while (*(int *)(puVar5 + 1) != 0x1ea);
          if (uVar7 == *(uint *)(puVar5[2] + 0x28)) {
            uVar6 = uVar1;
          }
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)(int)numskins);
    }
    (*pFVar4->_vptr_FListMenuItem[10])(pFVar4,0,(ulong)uVar6);
    uVar6 = (this->PlayerSkins).Array[(int)uVar6];
  }
  else {
LAB_0033f82d:
    uVar6 = 0;
    (*pFVar4->_vptr_FListMenuItem[8])(pFVar4,0,"Base");
    (*pFVar4->_vptr_FListMenuItem[10])(pFVar4,0,0);
  }
  local_38.Index = 0x1ee;
  pFVar4 = DListMenu::GetItem(&this->super_DListMenu,&local_38);
  if (pFVar4 != (FListMenuItem *)0x0) {
    (*pFVar4->_vptr_FListMenuItem[10])(pFVar4,0x10002,(ulong)uVar6);
  }
LAB_0033f895:
  UpdateTranslation(this);
  return;
}

Assistant:

void DPlayerMenu::UpdateSkins()
{
	int sel = 0;
	int skin;
	FListMenuItem *li = GetItem(NAME_Skin);
	if (li != NULL)
	{
		if (GetDefaultByType (PlayerClass->Type)->flags4 & MF4_NOSKIN ||
			players[consoleplayer].userinfo.GetPlayerClassNum() == -1)
		{
			li->SetString(0, "Base");
			li->SetValue(0, 0);
			skin = 0;
		}
		else
		{
			PlayerSkins.Clear();
			for(int i=0;i<(int)numskins; i++)
			{
				if (PlayerClass->CheckSkin(i))
				{
					int j = PlayerSkins.Push(i);
					li->SetString(j, skins[i].name);
					if (players[consoleplayer].userinfo.GetSkin() == i)
					{
						sel = j;
					}
				}
			}
			li->SetValue(0, sel);
			skin = PlayerSkins[sel];
		}
		li = GetItem(NAME_Playerdisplay);
		if (li != NULL)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_SKIN, skin);
		}
	}
	UpdateTranslation();
}